

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VIP.cpp
# Opt level: O3

void iniVIP(void)

{
  long *plVar1;
  int iVar2;
  int unaff_EBP;
  bool bVar3;
  char a;
  string s;
  stringstream ss;
  ifstream fin;
  ifstream test;
  char local_5e9;
  value_type local_5e8;
  long local_5c8 [16];
  ios_base local_548 [264];
  char local_440 [520];
  char local_238 [520];
  
  std::ifstream::ifstream(local_238,"VIPlist.txt",_S_in);
  while( true ) {
    plVar1 = (long *)std::istream::get(local_238);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
    unaff_EBP = unaff_EBP + (uint)(local_5e9 == '\n');
  }
  std::ifstream::ifstream(local_440,"VIPlist.txt",_S_in);
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  local_5e8._M_string_length = 0;
  local_5e8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_5c8);
  if (0 < unaff_EBP) {
    iVar2 = 0;
    do {
      local_5e8._M_string_length = 0;
      *local_5e8._M_dataplus._M_p = '\0';
      bVar3 = true;
      while( true ) {
        plVar1 = (long *)std::istream::get(local_440);
        if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
        if (local_5e9 < '!') {
          if ((local_5e9 == ' ') || (local_5e9 == '\n')) {
            if (!bVar3) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&Psws_abi_cxx11_,&local_5e8);
              break;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&Names_abi_cxx11_,&local_5e8);
            local_5e8._M_string_length = 0;
            *local_5e8._M_dataplus._M_p = '\0';
            bVar3 = false;
            std::ios::clear((int)*(undefined8 *)(local_5c8[0] + -0x18) + (int)local_5c8);
          }
        }
        else {
          std::__cxx11::string::push_back((char)&local_5e8);
        }
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != unaff_EBP);
  }
  std::ifstream::close();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_5c8);
  std::ios_base::~ios_base(local_548);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_440);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void iniVIP() {
    ifstream test("VIPlist.txt");
    int num;
    char a;
    while(test.get(a)){
        if(a == '\n'){
            num++;
        }
    }

    ifstream fin("VIPlist.txt");
    string s;
    stringstream ss;
    int i , j;
    for (i = 0; i < num; i++) {//ϣ��.size���û�������
        j = 0;
        s.erase();
        while (fin.get(a)) {
            if (a > 32) {
                s += a;
            } else if (a == ' ' || a == '\n') {
                switch (j){
                    case 0:
                        Names.push_back(s);
                        break;
                    case 1:
                        Psws.push_back(s);
                }
                j++;
                if(j > 1){
                    break;
                }

                s.erase();
                ss.clear();
            }
        }
    }
    fin.close();
}